

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall YAML::Stream::StreamInUtf32(Stream *this)

{
  ulong uVar1;
  long in_RDI;
  int i;
  int *pIndexes;
  uchar bytes [4];
  unsigned_long ch;
  int (*local_38) [4];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  byte local_14;
  uchar local_13;
  uchar local_12;
  uchar local_11;
  ulong local_10;
  
  local_10 = 0;
  if (*(int *)(in_RDI + 0x14) == 4) {
    local_38 = (int (*) [4])0x1180660;
  }
  else {
    local_38 = StreamInUtf32::indexes;
  }
  local_14 = GetNextByte((Stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_13 = GetNextByte((Stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_12 = GetNextByte((Stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_11 = GetNextByte((Stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      local_10 = local_10 << 8;
      local_10 = (&local_14)[(*local_38)[iVar2]] | local_10;
    }
    QueueUnicodeCodepoint((deque<char,_std::allocator<char>_> *)this,ch);
  }
  return;
}

Assistant:

void Stream::StreamInUtf32() const {
  static int indexes[2][4] = {{3, 2, 1, 0}, {0, 1, 2, 3}};

  unsigned long ch = 0;
  unsigned char bytes[4];
  int* pIndexes = (m_charSet == utf32be) ? indexes[1] : indexes[0];

  bytes[0] = GetNextByte();
  bytes[1] = GetNextByte();
  bytes[2] = GetNextByte();
  bytes[3] = GetNextByte();
  if (!m_input.good()) {
    return;
  }

  for (int i = 0; i < 4; ++i) {
    ch <<= 8;
    ch |= bytes[pIndexes[i]];
  }

  QueueUnicodeCodepoint(m_readahead, ch);
}